

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

DP_RS_Stream
EvpathInitReader(CP_Services Svcs,void *CP_Stream,void **ReaderContactInfoPtr,_SstParams *Params,
                attr_list WriterContact,SstStats Stats)

{
  undefined4 uVar1;
  void *__s;
  undefined8 *__s_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined8 uVar6;
  long in_RCX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R9;
  attr_list ContactList;
  attr_list ListenAttrs;
  CManager CM;
  CMFormat F;
  SMPI_Comm comm;
  char *EvpathContactString;
  CManager cm;
  EvpathReaderContactInfo Contact;
  Evpath_RS_Stream Stream;
  int *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  
  __s = malloc(0xa0);
  __s_00 = (undefined8 *)malloc(0x18);
  uVar2 = (**(code **)(in_RDI + 8))(in_RSI);
  (**(code **)(in_RDI + 0x18))(in_RSI);
  uVar3 = (**(code **)(in_RDI + 8))(in_RSI);
  uVar4 = create_attr_list();
  memset(__s,0,0xa0);
  memset(__s_00,0,0x18);
  *(undefined8 *)((long)__s + 8) = in_RSI;
  *(undefined8 *)((long)__s + 0x90) = in_R9;
  *(undefined8 *)((long)__s + 0x98) = 0xffffffffffffffff;
  pthread_mutex_init((pthread_mutex_t *)((long)__s + 0x18),(pthread_mutexattr_t *)0x0);
  SMPI_Comm_rank((SMPI_Comm)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
  if (*(long *)(in_RCX + 0x28) == 0) {
    uVar1 = attr_atom_from_string("CM_TRANSPORT");
    pcVar5 = strdup("sockets");
    set_string_attr(uVar4,uVar1,pcVar5);
  }
  else {
    uVar1 = attr_atom_from_string("CM_TRANSPORT");
    pcVar5 = strdup(*(char **)(in_RCX + 0x28));
    set_string_attr(uVar4,uVar1,pcVar5);
  }
  if (*(long *)(in_RCX + 0x68) == 0) {
    if (*(long *)(in_RCX + 0x58) != 0) {
      uVar6 = uVar4;
      uVar1 = attr_atom_from_string("IP_INTERFACE");
      pcVar5 = strdup(*(char **)(in_RCX + 0x58));
      set_string_attr(uVar6,uVar1,pcVar5);
    }
  }
  else {
    uVar1 = attr_atom_from_string("IP_INTERFACE");
    pcVar5 = strdup(*(char **)(in_RCX + 0x68));
    set_string_attr(uVar4,uVar1,pcVar5);
  }
  CMlisten_specific(uVar3,uVar4);
  uVar3 = CMget_specific_contact_list(uVar3,uVar4);
  uVar6 = attr_list_to_string(uVar3);
  free_attr_list(uVar3);
  free_attr_list(uVar4);
  uVar3 = CMregister_format(uVar2,EvpathReadRequestStructs);
  *(undefined8 *)((long)__s + 0x10) = uVar3;
  uVar3 = CMregister_format(uVar2,EvpathReadReplyStructs);
  CMregister_handler(uVar3,EvpathReadReplyHandler,in_RDI);
  uVar2 = CMregister_format(uVar2,EvpathPreloadStructs);
  CMregister_handler(uVar2,EvpathPreloadHandler,in_RDI);
  *__s_00 = uVar6;
  __s_00[2] = __s;
  *(undefined8 **)((long)__s + 0x68) = __s_00;
  *in_RDX = __s_00;
  return __s;
}

Assistant:

static DP_RS_Stream EvpathInitReader(CP_Services Svcs, void *CP_Stream, void **ReaderContactInfoPtr,
                                     struct _SstParams *Params, attr_list WriterContact,
                                     SstStats Stats)
{
    Evpath_RS_Stream Stream = malloc(sizeof(struct _Evpath_RS_Stream));
    EvpathReaderContactInfo Contact = malloc(sizeof(struct _EvpathReaderContactInfo));
    CManager cm = Svcs->getCManager(CP_Stream);
    char *EvpathContactString;
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;
    CManager CM = Svcs->getCManager(CP_Stream);
    attr_list ListenAttrs = create_attr_list();

    memset(Stream, 0, sizeof(*Stream));
    memset(Contact, 0, sizeof(*Contact));

    /*
     * save the CP_stream value of later use
     */
    Stream->CP_Stream = CP_Stream;
    Stream->Stats = Stats;
    Stream->LastPreloadTimestep = -1;

    pthread_mutex_init(&Stream->DataLock, NULL);

    SMPI_Comm_rank(comm, &Stream->Rank);

    if (Params->WANDataTransport)
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("CM_TRANSPORT"),
                        strdup(Params->WANDataTransport));
    }
    else
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("CM_TRANSPORT"), strdup("sockets"));
    }

    if (Params->DataInterface)
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("IP_INTERFACE"),
                        strdup(Params->DataInterface));
    }
    else if (Params->NetworkInterface)
    {
        set_string_attr(ListenAttrs, attr_atom_from_string("IP_INTERFACE"),
                        strdup(Params->NetworkInterface));
    }
    CMlisten_specific(CM, ListenAttrs);
    attr_list ContactList = CMget_specific_contact_list(CM, ListenAttrs);

    EvpathContactString = attr_list_to_string(ContactList);

    free_attr_list(ContactList);
    free_attr_list(ListenAttrs);

    /*
     * add a handler for read reply messages
     */
    Stream->ReadRequestFormat = CMregister_format(cm, EvpathReadRequestStructs);
    F = CMregister_format(cm, EvpathReadReplyStructs);
    CMregister_handler(F, EvpathReadReplyHandler, Svcs);

    /*
     * add a handler for timestep preload messages
     */
    F = CMregister_format(cm, EvpathPreloadStructs);
    CMregister_handler(F, EvpathPreloadHandler, Svcs);

    Contact->ContactString = EvpathContactString;
    Contact->RS_Stream = Stream;
    Stream->MyContactInfo = Contact;

    *ReaderContactInfoPtr = Contact;

    return Stream;
}